

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O0

void hyperplane_internal(int ndims,int *dims,int *original_grid_dimensions,int *grid_points,
                        int n_nodes,int n_processes_p_node,int my_rank,int *new_rank_coords,
                        int my_partition,double *angle_values,int grid_size,int *dimension_order,
                        int partition_id)

{
  int n_nodes_00;
  bool bVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  long in_RSI;
  int in_EDI;
  undefined4 in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  int in_stack_00000010;
  undefined4 in_stack_00000014;
  int in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  int in_stack_00000028;
  undefined4 in_stack_0000002c;
  int in_stack_00000030;
  undefined4 in_stack_00000034;
  int in_stack_00000038;
  int remaining_partitions;
  int tmp;
  int split_rhs;
  int split_lhs;
  int subvolume;
  int i;
  int best_dimension_index;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  double *in_stack_ffffffffffffff80;
  int local_5c;
  int local_58;
  int n_processes_p_node_00;
  int iVar3;
  
  hyperplane_dimension_order
            (in_stack_ffffffffffffff80,
             (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             (int *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (in_stack_00000028 == in_R9D * 2 ||
      SBORROW4(in_stack_00000028,in_R9D * 2) != in_stack_00000028 + in_R9D * -2 < 0) {
    base_case_new_coord_calculation
              (in_EDI,in_stack_00000008,in_stack_00000038,in_R9D,in_RCX,
               (int *)CONCAT44(in_stack_00000014,in_stack_00000010),
               (int *)CONCAT44(in_stack_00000034,in_stack_00000030));
  }
  else {
    for (n_processes_p_node_00 = 0; n_processes_p_node_00 < in_EDI;
        n_processes_p_node_00 = n_processes_p_node_00 + 1) {
      n_nodes_00 = *(int *)(CONCAT44(in_stack_00000034,in_stack_00000030) +
                           (long)n_processes_p_node_00 * 4);
      if (*(int *)(in_RSI + (long)n_nodes_00 * 4) != 1) {
        if (in_R9D == 0) {
          __assert_fail("n_processes_p_node != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/reordering_algorithms/hyperplane/hyperplane.cpp"
                        ,0x8e,
                        "void hyperplane_internal(const int, int *, const int *, int *, const int, const int, const int, int *, const int, const double *, int, int *, int)"
                       );
        }
        if (*(int *)(in_RSI + (long)n_nodes_00 * 4) == 0) {
          __assert_fail("dims[best_dimension_index] != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/viennamapping[P]mpicartreorderlib/src/reordering_algorithms/hyperplane/hyperplane.cpp"
                        ,0x8f,
                        "void hyperplane_internal(const int, int *, const int *, int *, const int, const int, const int, int *, const int, const double *, int, int *, int)"
                       );
        }
        iVar2 = in_stack_00000028 / *(int *)(in_RSI + (long)n_nodes_00 * 4);
        local_58 = *(int *)(in_RSI + (long)n_nodes_00 * 4) / 2;
        local_5c = *(int *)(in_RSI + (long)n_nodes_00 * 4) - local_58;
        while( true ) {
          iVar3 = local_5c;
          bVar1 = false;
          if (((iVar2 * local_58) % in_R9D != 0) &&
             (bVar1 = false, (iVar2 * local_5c) % in_R9D != 0)) {
            bVar1 = 1 < local_58;
          }
          if (!bVar1) break;
          local_58 = local_58 + -1;
          local_5c = local_5c + 1;
        }
        if (in_RDX[n_nodes_00] / 2 <=
            in_RCX[n_nodes_00 << 1] + *(int *)(in_RSI + (long)n_nodes_00 * 4) / 2) {
          local_5c = local_58;
          local_58 = iVar3;
        }
        if (((iVar2 * local_58) % in_R9D == 0) && ((iVar2 * local_5c) % in_R9D == 0)) {
          iVar3 = (int)((ulong)in_RSI >> 0x20);
          if (in_stack_00000018 < in_stack_00000038 + (iVar2 * local_58) / in_R9D) {
            in_RCX[n_nodes_00 * 2 + 1] = in_RCX[n_nodes_00 << 1] + local_58 + -1;
            *(int *)(in_RSI + (long)n_nodes_00 * 4) = local_58;
            hyperplane_internal(iVar3,in_RDX,in_RCX,(int *)CONCAT44(in_R8D,in_R9D),n_nodes_00,
                                n_processes_p_node_00,unaff_retaddr,
                                (int *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                                in_stack_00000010,
                                (double *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                                in_stack_00000020,
                                (int *)CONCAT44(in_stack_0000002c,in_stack_00000028),
                                in_stack_00000030);
            return;
          }
          in_RCX[n_nodes_00 << 1] = in_RCX[n_nodes_00 << 1] + local_58;
          *(int *)(in_RSI + (long)n_nodes_00 * 4) = local_5c;
          hyperplane_internal(iVar3,in_RDX,in_RCX,(int *)CONCAT44(in_R8D,in_R9D),n_nodes_00,
                              n_processes_p_node_00,unaff_retaddr,
                              (int *)CONCAT44(in_stack_0000000c,in_stack_00000008),in_stack_00000010
                              ,(double *)CONCAT44(in_stack_0000001c,in_stack_00000018),
                              in_stack_00000020,(int *)CONCAT44(in_stack_0000002c,in_stack_00000028)
                              ,in_stack_00000030);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void hyperplane_internal(const int ndims,
			 int dims[],
			 const int original_grid_dimensions[],
			 int grid_points[],
			 const int n_nodes,
			 const int n_processes_p_node,
			 const int my_rank,
			 int new_rank_coords[],
			 const int my_partition,
			 const double angle_values[],
			 int grid_size,
			 int dimension_order[],
			 int partition_id) {
  hyperplane_dimension_order(angle_values, dims, ndims, dimension_order);
  //Entering base case is either having two
  //nodes or one and then fill it up
  if (grid_size <= 2 * n_processes_p_node) {
	base_case_new_coord_calculation(ndims,
					my_rank,
					partition_id,
					n_processes_p_node,
					grid_points,
					new_rank_coords,
					dimension_order);

	return;
  }

  //Find the split and recurse
  //O ( ndims)
  int best_dimension_index;
  for (int i{0}; i < ndims; i++) {
	best_dimension_index = dimension_order[i];
	if (dims[best_dimension_index] == 1) {
	  continue;
	}

	assert(n_processes_p_node != 0);
	assert(dims[best_dimension_index] != 0);
	//Try to split s.t both sides are a multiple of the number of processes on a node
	int subvolume = grid_size / dims[best_dimension_index];

	//Initial positioning of hyperplane
	int split_lhs, split_rhs;
	split_lhs = dims[best_dimension_index] / 2;
	split_rhs = dims[best_dimension_index] - split_lhs;

	//Try to find split along dimension with balanced sizes
	//O( dims[best_dimension_index] )
	while ((subvolume * split_lhs) % n_processes_p_node != 0 &&
		(subvolume * split_rhs) % n_processes_p_node != 0 && split_lhs > 1) {
	  split_lhs -= 1;
	  split_rhs += 1;
	}

	//swap the two variables if the leftside of the subgrid is closer to right boundary
	if (grid_points[2 * best_dimension_index] + dims[best_dimension_index] / 2 >=
		original_grid_dimensions[best_dimension_index] / 2) {
	  int tmp = split_rhs;
	  split_rhs = split_lhs;
	  split_lhs = tmp;
	}

	//If partition was found, recurse
	if (subvolume * split_lhs % n_processes_p_node == 0 &&
		subvolume * split_rhs % n_processes_p_node == 0) {
	  //Adjust and enter the recursion
	  int remaining_partitions = subvolume * split_lhs / n_processes_p_node;

	  //case for the left hand side
	  if (my_partition < partition_id + remaining_partitions) {
		//adjust the grid points left hand side
		grid_points[2 * best_dimension_index + 1] = grid_points[2 * best_dimension_index] + split_lhs - 1;

		//adjust the dimensions left hand side
		dims[best_dimension_index] = split_lhs;

		hyperplane_internal(ndims, dims,
					original_grid_dimensions,
					grid_points,
					n_nodes,
					n_processes_p_node,
					my_rank,
					new_rank_coords,
					my_partition,
					angle_values,
					subvolume * split_lhs,
					dimension_order,
					partition_id);
	  }
		//case for the right hand side
	  else {
		//adjust the grid points rhs
		grid_points[2 * best_dimension_index] = grid_points[2 * best_dimension_index] + split_lhs;
		//adjust the dimesion size rhs
		dims[best_dimension_index] = split_rhs;

		hyperplane_internal(ndims, dims,
				original_grid_dimensions,
				grid_points, n_nodes,
				n_processes_p_node,
				my_rank,
				new_rank_coords,
				my_partition,
				angle_values,
				subvolume * split_rhs,
				dimension_order,
				partition_id + remaining_partitions);
	  }
	  //Exit for loop!
	  break;
	}
  }
}